

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O1

void gdPutInt(int w,gdIOCtx *ctx)

{
  (*ctx->putC)(ctx,(uint)w >> 0x18);
  (*ctx->putC)(ctx,(uint)w >> 0x10 & 0xff);
  (*ctx->putC)(ctx,(uint)w >> 8 & 0xff);
  (*ctx->putC)(ctx,w & 0xff);
  return;
}

Assistant:

void gdPutInt (int w, gdIOCtx *ctx)
{
	IO_DBG(printf("Putting int...\n"));
	(ctx->putC)(ctx, (unsigned char) (w >> 24));
	(ctx->putC)(ctx, (unsigned char) ((w >> 16) & 0xFF));
	(ctx->putC)(ctx, (unsigned char) ((w >> 8) & 0xFF));
	(ctx->putC)(ctx, (unsigned char) (w & 0xFF));
	IO_DBG(printf("put.\n"));
}